

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O0

bool __thiscall spirv_cross::Compiler::flush_phi_required(Compiler *this,BlockID from,BlockID to)

{
  bool bVar1;
  uint32_t id;
  SPIRBlock *pSVar2;
  Phi *pPVar3;
  Phi *phi;
  Phi *__end1;
  Phi *__begin1;
  SmallVector<spirv_cross::SPIRBlock::Phi,_8UL> *__range1;
  SPIRBlock *child;
  Compiler *this_local;
  TypedID<(spirv_cross::Types)6> local_10;
  BlockID to_local;
  BlockID from_local;
  
  this_local._4_4_ = to.id;
  local_10.id = from.id;
  id = TypedID::operator_cast_to_unsigned_int((TypedID *)((long)&this_local + 4));
  pSVar2 = get<spirv_cross::SPIRBlock>(this,id);
  __end1 = VectorView<spirv_cross::SPIRBlock::Phi>::begin
                     (&(pSVar2->phi_variables).super_VectorView<spirv_cross::SPIRBlock::Phi>);
  pPVar3 = VectorView<spirv_cross::SPIRBlock::Phi>::end
                     (&(pSVar2->phi_variables).super_VectorView<spirv_cross::SPIRBlock::Phi>);
  while( true ) {
    if (__end1 == pPVar3) {
      return false;
    }
    bVar1 = TypedID<(spirv_cross::Types)6>::operator==(&__end1->parent,&local_10);
    if (bVar1) break;
    __end1 = __end1 + 1;
  }
  return true;
}

Assistant:

bool Compiler::flush_phi_required(BlockID from, BlockID to) const
{
	auto &child = get<SPIRBlock>(to);
	for (auto &phi : child.phi_variables)
		if (phi.parent == from)
			return true;
	return false;
}